

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fak_algorithm.c
# Opt level: O2

void fak_a(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int i;
  long lVar4;
  solver_state_a s;
  
  setup_simple_state_a(&two_dof_robot_a,&s);
  lVar1 = 0x20;
  lVar2 = 0;
  for (lVar4 = 1; lVar4 <= s.nbody; lVar4 = lVar4 + 1) {
    lVar3 = _two_dof_robot_c + lVar2 + 0x20;
    kca_fpk(lVar3,(long)&s.x_jnt[-1].target_body + lVar1);
    ga_pose_compose((long)&s.x_jnt[-1].target_body + lVar1,_two_dof_robot_c + lVar2,
                    (long)&s.x_rel[-1].target_body + lVar1);
    kca_fvk(lVar3,(long)&s.xd_jnt[-1].target_body + lVar1);
    ga_twist_tf_ref_to_tgt
              ((long)&s.x_rel[-1].target_body + lVar1,(long)&s.xd[-1].target_body + lVar1,
               (long)&s.xd_tf[-1].target_body + lVar1);
    ga_twist_accumulate((long)&s.xd_tf[-1].target_body + lVar1,
                        (long)&s.xd_jnt[-1].target_body + lVar1,(long)&(s.xd)->target_body + lVar1);
    kca_fak(lVar3,(long)&s.xdd_jnt[-1].target_body + lVar1);
    kca_inertial_acceleration
              (lVar3,(long)&(s.xd)->target_body + lVar1,(long)&s.xdd_bias[-1].target_body + lVar1);
    ga_acc_twist_add((long)&s.xdd_jnt[-1].target_body + lVar1,
                     (long)&s.xdd_bias[-1].target_body + lVar1,
                     (long)&s.xdd_net[-1].target_body + lVar1);
    ga_acc_twist_tf_ref_to_tgt
              ((long)&s.x_rel[-1].target_body + lVar1,(long)&s.xdd[-1].target_body + lVar1,
               (long)&s.xdd_tf[-1].target_body + lVar1);
    ga_acc_twist_accumulate
              ((long)&s.xdd_tf[-1].target_body + lVar1,(long)&s.xdd_net[-1].target_body + lVar1,
               (long)&(s.xdd)->target_body + lVar1);
    lVar1 = lVar1 + 0x20;
    lVar2 = lVar2 + 0x60;
  }
  ga_acc_twist_log(s.xdd + s.nbody);
  return;
}

Assistant:

void fak_a()
{
    struct kca_kinematic_chain *kc = &two_dof_robot_a;
    struct solver_state_a s;

    setup_simple_state_a(kc, &s);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Position
        //

        // X_{J,i}
        kca_fpk(joint, &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        ga_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kca_fvk(joint, &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        ga_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        ga_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);


        // Acceleration
        //

        // Xdd_{J,i} = S_i qdd_i
        kca_fak(joint, &s.xdd_jnt[i - 1]);

        // Xdd_{bias,i} = S_i qdd_i + Sd_i qd_i + Xd_i x S_i qd_i
        kca_inertial_acceleration(joint, &s.xd[i], &s.xdd_bias[i - 1]);

        // Xdd_{J,i}' = Xdd_{J,i} + Xdd_{bias,i}
        ga_acc_twist_add(&s.xdd_jnt[i - 1], &s.xdd_bias[i - 1], &s.xdd_net[i - 1]);

        // Xdd_{i-1}' = i^X_{i-1} Xdd_{i-1}
        ga_acc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xdd[i - 1], &s.xdd_tf[i - 1]);

        // Xdd_i = Xdd_{i-1}' + Xdd_{J,i}'
        ga_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_net[i - 1], &s.xdd[i]);
    }

    ga_acc_twist_log(&s.xdd[s.nbody]);
}